

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_sent
          (bt_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  _Atomic_word *p_Var1;
  int iVar2;
  pointer prVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  time_point32 tVar6;
  iterator i;
  pointer prVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar9;
  int iVar10;
  pointer __src;
  element_type *peVar11;
  pointer prVar12;
  bool bVar13;
  
  iVar5 = (int)bytes_transferred;
  if (error->failed_ != true) {
    prVar12 = (this->m_payloads).
              super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
              ._M_impl.super__Vector_impl_data._M_start;
    prVar3 = (this->m_payloads).
             super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (prVar12 != prVar3) {
      iVar9 = 0;
      prVar7 = prVar12;
      __src = prVar12;
      do {
        iVar8 = prVar7->start - iVar5;
        prVar7->start = iVar8;
        if (iVar8 < 0) {
          iVar2 = prVar7->length;
          iVar10 = iVar2 + iVar8;
          if (iVar10 == 0 || SCARRY4(iVar2,iVar8) != iVar10 < 0) {
            iVar9 = iVar9 + iVar2;
            __src = __src + 1;
          }
          else {
            iVar9 = iVar9 - iVar8;
            prVar7->length = iVar10;
            prVar7->start = 0;
          }
        }
        prVar7 = prVar7 + 1;
      } while (prVar7 != prVar3);
      if (__src != prVar12) {
        prVar7 = __src;
        if ((long)prVar3 - (long)__src != 0) {
          memmove(prVar12,__src,(long)prVar3 - (long)__src);
          prVar7 = (this->m_payloads).
                   super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        prVar12 = (pointer)((long)prVar12 + ((long)prVar7 - (long)__src));
        if (prVar7 != prVar12) {
          (this->m_payloads).
          super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
          ._M_impl.super__Vector_impl_data._M_finish = prVar12;
        }
      }
      peer_connection::sent_bytes(&this->super_peer_connection,iVar9,iVar5 - iVar9);
      if ((0 < iVar9) &&
         (p_Var4 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                   super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi, p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
         ) {
        peVar11 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
        }
        iVar5 = p_Var4->_M_use_count;
        do {
          if (iVar5 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            peVar11 = (element_type *)0x0;
            goto LAB_001919b4;
          }
          LOCK();
          iVar9 = p_Var4->_M_use_count;
          bVar13 = iVar5 == iVar9;
          if (bVar13) {
            p_Var4->_M_use_count = iVar5 + 1;
            iVar9 = iVar5;
          }
          iVar5 = iVar9;
          UNLOCK();
        } while (!bVar13);
        this_00 = p_Var4;
        if (p_Var4->_M_use_count == 0) {
          peVar11 = (element_type *)0x0;
        }
LAB_001919b4:
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var4->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = p_Var4->_M_weak_count;
          p_Var4->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*p_Var4->_vptr__Sp_counted_base[3])();
        }
        if (peVar11 != (element_type *)0x0) {
          tVar6 = time_now32();
          (peVar11->m_last_upload).__d.__r = (rep_conflict)tVar6.__d.__r;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          return;
        }
      }
      return;
    }
  }
  peer_connection::sent_bytes(&this->super_peer_connection,0,iVar5);
  return;
}

Assistant:

void bt_peer_connection::on_sent(error_code const& error
		, std::size_t const bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			sent_bytes(0, int(bytes_transferred));
			return;
		}

		// manage the payload markers
		int amount_payload = 0;
		if (!m_payloads.empty())
		{
			// this points to the first entry to not erase. i.e.
			// [begin, first_to_keep) will be erased because
			// the payload ranges they represent have been sent
			auto first_to_keep = m_payloads.begin();

			for (auto i = m_payloads.begin(); i != m_payloads.end(); ++i)
			{
				i->start -= int(bytes_transferred);
				if (i->start < 0)
				{
					if (i->start + i->length <= 0)
					{
						amount_payload += i->length;
						TORRENT_ASSERT(first_to_keep == i);
						++first_to_keep;
					}
					else
					{
						amount_payload += -i->start;
						i->length -= -i->start;
						i->start = 0;
					}
				}
			}

			// remove all payload ranges that have been sent
			m_payloads.erase(m_payloads.begin(), first_to_keep);
		}

		TORRENT_ASSERT(amount_payload <= int(bytes_transferred));
		sent_bytes(amount_payload, int(bytes_transferred) - amount_payload);

		if (amount_payload > 0)
		{
			auto t = associated_torrent().lock();
			TORRENT_ASSERT(t);
			if (t) t->update_last_upload();
		}
	}